

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

field_type __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
::count(btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
        *this)

{
  byte bVar1;
  byte bVar2;
  field_type fVar3;
  field_type fVar4;
  btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *this_local;
  
  bVar1 = finish(this);
  bVar2 = start(this);
  if (bVar2 <= bVar1) {
    fVar3 = finish(this);
    fVar4 = start(this);
    return fVar3 - fVar4;
  }
  __assert_fail("finish() >= start()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                ,0x2ba,
                "field_type absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::count() const [Params = absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
               );
}

Assistant:

field_type count() const {
    assert(finish() >= start());
    return finish() - start();
  }